

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::internal::UnitTestImpl::ConfigureStreamingOutput(UnitTestImpl *this)

{
  size_type __n;
  StreamingListener *this_00;
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (FLAGS_gtest_stream_result_to_abi_cxx11_._8_8_ != 0) {
    __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FLAGS_gtest_stream_result_to_abi_cxx11_,':',0);
    if (__n == 0xffffffffffffffff) {
      GTestLog::GTestLog((GTestLog *)&local_60,GTEST_WARNING,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/googletest/googletest/src/gtest.cc"
                         ,0x1614);
      poVar1 = std::operator<<((ostream *)&std::cerr,"unrecognized streaming target \"");
      poVar1 = std::operator<<(poVar1,(string *)FLAGS_gtest_stream_result_to_abi_cxx11_);
      std::operator<<(poVar1,"\" ignored.");
      GTestLog::~GTestLog((GTestLog *)&local_60);
    }
    else {
      this_00 = (StreamingListener *)operator_new(0x10);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 FLAGS_gtest_stream_result_to_abi_cxx11_,0,__n);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 FLAGS_gtest_stream_result_to_abi_cxx11_,__n + 1,0xffffffffffffffff);
      StreamingListener::StreamingListener(this_00,&local_60,&local_40);
      TestEventListeners::Append(&this->listeners_,(TestEventListener *)this_00);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
    }
  }
  return;
}

Assistant:

SingleFailureChecker::SingleFailureChecker(const TestPartResultArray* results,
                                           TestPartResult::Type type,
                                           const std::string& substr)
    : results_(results), type_(type), substr_(substr) {}